

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

int deqp::gles31::bb::anon_unknown_11::computeReferenceLayout
              (BufferLayout *layout,int curBlockNdx,int baseOffset,string *curPrefix,VarType *type,
              deUint32 layoutFlags)

{
  undefined4 uVar1;
  bool bVar2;
  DataType DVar3;
  int iVar4;
  int iVar5;
  StructType *pSVar6;
  pointer pSVar7;
  char *__rhs;
  VarType *pVVar8;
  int local_2bc;
  int local_294;
  deInt32 local_27c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_230;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_228;
  ConstIterator memberIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int local_19c;
  undefined1 local_198 [4];
  int elemNdx;
  undefined1 local_178 [8];
  BufferVarLayoutEntry entry_2;
  int vecStride;
  int numVecs_1;
  undefined1 local_120 [3];
  bool isRowMajor_1;
  DataType elemBasicType_1;
  undefined1 local_100 [8];
  BufferVarLayoutEntry entry_1;
  int stride;
  DataType elemBasicType;
  VarType *elemType;
  int numVecs;
  bool isRowMajor;
  undefined1 local_90 [8];
  BufferVarLayoutEntry entry;
  DataType basicType;
  int topLevelArrayStride;
  int topLevelArraySize;
  int curOffset;
  int baseAlignment;
  bool isStd140;
  deUint32 layoutFlags_local;
  VarType *type_local;
  string *curPrefix_local;
  int baseOffset_local;
  int curBlockNdx_local;
  BufferLayout *layout_local;
  
  if ((layoutFlags & 4) == 0) {
    local_27c = computeStd430BaseAlignment(type,layoutFlags);
  }
  else {
    local_27c = computeStd140BaseAlignment(type,layoutFlags);
  }
  topLevelArrayStride = deAlign32(baseOffset,local_27c);
  bVar2 = glu::VarType::isBasicType(type);
  if (bVar2) {
    entry._68_4_ = glu::VarType::getBasicType(type);
    BufferVarLayoutEntry::BufferVarLayoutEntry((BufferVarLayoutEntry *)local_90);
    std::__cxx11::string::operator=((string *)local_90,(string *)curPrefix);
    entry.name.field_2._8_4_ = entry._68_4_;
    entry.blockNdx = 1;
    entry.offset = 0;
    entry.arraySize = 0;
    entry.arrayStride = 1;
    entry.matrixStride = 0;
    entry.name.field_2._12_4_ = curBlockNdx;
    bVar2 = glu::isDataTypeMatrix(entry._68_4_);
    entry.type = topLevelArrayStride;
    if (bVar2) {
      bVar2 = (layoutFlags & 0x10) != 0;
      if (bVar2) {
        local_294 = glu::getDataTypeMatrixNumRows(entry._68_4_);
      }
      else {
        local_294 = glu::getDataTypeMatrixNumColumns(entry._68_4_);
      }
      entry.arraySize = local_27c;
      local_294 = local_294 * local_27c;
      entry.topLevelArraySize._0_1_ = bVar2;
    }
    else {
      local_294 = getDataTypeByteSize(entry._68_4_);
    }
    topLevelArrayStride = local_294 + topLevelArrayStride;
    std::
    vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
    ::push_back(&layout->bufferVars,(value_type *)local_90);
    BufferVarLayoutEntry::~BufferVarLayoutEntry((BufferVarLayoutEntry *)local_90);
  }
  else {
    bVar2 = glu::VarType::isArrayType(type);
    if (bVar2) {
      pVVar8 = glu::VarType::getElementType(type);
      bVar2 = glu::VarType::isBasicType(pVVar8);
      if (bVar2) {
        DVar3 = glu::VarType::getBasicType(pVVar8);
        bVar2 = glu::isDataTypeMatrix(DVar3);
        if (!bVar2) {
          entry_1._68_4_ = glu::VarType::getBasicType(pVVar8);
          entry_1._64_4_ = local_27c;
          BufferVarLayoutEntry::BufferVarLayoutEntry((BufferVarLayoutEntry *)local_100);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120,curPrefix,"[0]");
          std::__cxx11::string::operator=((string *)local_100,(string *)local_120);
          std::__cxx11::string::~string((string *)local_120);
          entry_1.name.field_2._8_4_ = entry_1._68_4_;
          entry_1.name.field_2._12_4_ = curBlockNdx;
          entry_1.type = topLevelArrayStride;
          entry_1.blockNdx = glu::VarType::getArraySize(type);
          uVar1 = entry_1._64_4_;
          entry_1.offset = entry_1._64_4_;
          entry_1.arraySize = 0;
          entry_1.arrayStride = 1;
          entry_1.matrixStride = 0;
          iVar5 = glu::VarType::getArraySize(type);
          topLevelArrayStride = topLevelArrayStride + uVar1 * iVar5;
          std::
          vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
          ::push_back(&layout->bufferVars,(value_type *)local_100);
          BufferVarLayoutEntry::~BufferVarLayoutEntry((BufferVarLayoutEntry *)local_100);
          goto LAB_023f7adc;
        }
      }
      bVar2 = glu::VarType::isBasicType(pVVar8);
      if (bVar2) {
        DVar3 = glu::VarType::getBasicType(pVVar8);
        bVar2 = glu::isDataTypeMatrix(DVar3);
        if (bVar2) {
          DVar3 = glu::VarType::getBasicType(pVVar8);
          bVar2 = (layoutFlags & 0x10) != 0;
          if (bVar2) {
            local_2bc = glu::getDataTypeMatrixNumRows(DVar3);
          }
          else {
            local_2bc = glu::getDataTypeMatrixNumColumns(DVar3);
          }
          entry_2._68_4_ = local_2bc;
          entry_2._64_4_ = local_27c;
          BufferVarLayoutEntry::BufferVarLayoutEntry((BufferVarLayoutEntry *)local_178);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,curPrefix,"[0]");
          std::__cxx11::string::operator=((string *)local_178,(string *)local_198);
          std::__cxx11::string::~string((string *)local_198);
          entry_2.name.field_2._8_4_ = DVar3;
          entry_2.name.field_2._12_4_ = curBlockNdx;
          entry_2.type = topLevelArrayStride;
          entry_2.blockNdx = glu::VarType::getArraySize(type);
          entry_2.offset = entry_2._64_4_ * entry_2._68_4_;
          entry_2.arraySize = entry_2._64_4_;
          entry_2.arrayStride = 1;
          entry_2.matrixStride = 0;
          iVar5 = entry_2._68_4_ * entry_2._64_4_;
          entry_2.topLevelArraySize._0_1_ = bVar2;
          iVar4 = glu::VarType::getArraySize(type);
          topLevelArrayStride = topLevelArrayStride + iVar5 * iVar4;
          std::
          vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
          ::push_back(&layout->bufferVars,(value_type *)local_178);
          BufferVarLayoutEntry::~BufferVarLayoutEntry((BufferVarLayoutEntry *)local_178);
          goto LAB_023f7adc;
        }
      }
      for (local_19c = 0; iVar5 = local_19c, iVar4 = glu::VarType::getArraySize(type), iVar5 < iVar4
          ; local_19c = local_19c + 1) {
        std::operator+(&local_200,curPrefix,"[");
        de::toString<int>((string *)&memberIter,&local_19c);
        std::operator+(&local_1e0,&local_200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &memberIter);
        std::operator+(&local_1c0,&local_1e0,"]");
        pVVar8 = glu::VarType::getElementType(type);
        iVar5 = computeReferenceLayout
                          (layout,curBlockNdx,topLevelArrayStride,&local_1c0,pVVar8,layoutFlags);
        topLevelArrayStride = iVar5 + topLevelArrayStride;
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&memberIter);
        std::__cxx11::string::~string((string *)&local_200);
      }
    }
    else {
      pSVar6 = glu::VarType::getStructPtr(type);
      local_228._M_current = (StructMember *)glu::StructType::begin(pSVar6);
      while( true ) {
        pSVar6 = glu::VarType::getStructPtr(type);
        local_230._M_current = (StructMember *)glu::StructType::end(pSVar6);
        bVar2 = __gnu_cxx::operator!=(&local_228,&local_230);
        if (!bVar2) break;
        std::operator+(&local_270,curPrefix,".");
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
                 ::operator->(&local_228);
        __rhs = glu::StructMember::getName(pSVar7);
        std::operator+(&local_250,&local_270,__rhs);
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
                 ::operator->(&local_228);
        pVVar8 = glu::StructMember::getType(pSVar7);
        iVar5 = computeReferenceLayout
                          (layout,curBlockNdx,topLevelArrayStride,&local_250,pVVar8,layoutFlags);
        topLevelArrayStride = iVar5 + topLevelArrayStride;
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        __gnu_cxx::
        __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
        ::operator++(&local_228,0);
      }
      topLevelArrayStride = deAlign32(topLevelArrayStride,local_27c);
    }
  }
LAB_023f7adc:
  return topLevelArrayStride - baseOffset;
}

Assistant:

int computeReferenceLayout (
	BufferLayout&		layout,
	int					curBlockNdx,
	int					baseOffset,
	const std::string&	curPrefix,
	const VarType&		type,
	deUint32			layoutFlags)
{
	// Reference layout uses std430 rules by default. std140 rules are
	// choosen only for blocks that have std140 layout.
	const bool	isStd140			= (layoutFlags & LAYOUT_STD140) != 0;
	const int	baseAlignment		= isStd140 ? computeStd140BaseAlignment(type, layoutFlags)
											   : computeStd430BaseAlignment(type, layoutFlags);
	int			curOffset			= deAlign32(baseOffset, baseAlignment);
	const int	topLevelArraySize	= 1; // Default values
	const int	topLevelArrayStride	= 0;

	if (type.isBasicType())
	{
		const glu::DataType		basicType	= type.getBasicType();
		BufferVarLayoutEntry	entry;

		entry.name					= curPrefix;
		entry.type					= basicType;
		entry.arraySize				= 1;
		entry.arrayStride			= 0;
		entry.matrixStride			= 0;
		entry.topLevelArraySize		= topLevelArraySize;
		entry.topLevelArrayStride	= topLevelArrayStride;
		entry.blockNdx				= curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			const bool	isRowMajor			= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	numVecs				= isRowMajor ? glu::getDataTypeMatrixNumRows(basicType)
														 : glu::getDataTypeMatrixNumColumns(basicType);

			entry.offset		= curOffset;
			entry.matrixStride	= baseAlignment;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*baseAlignment;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.bufferVars.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType&	elemType	= type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			const glu::DataType		elemBasicType	= elemType.getBasicType();
			const int				stride			= baseAlignment;
			BufferVarLayoutEntry	entry;

			entry.name					= curPrefix + "[0]"; // Array variables are always postfixed with [0]
			entry.type					= elemBasicType;
			entry.blockNdx				= curBlockNdx;
			entry.offset				= curOffset;
			entry.arraySize				= type.getArraySize();
			entry.arrayStride			= stride;
			entry.matrixStride			= 0;
			entry.topLevelArraySize		= topLevelArraySize;
			entry.topLevelArrayStride	= topLevelArrayStride;

			curOffset += stride*type.getArraySize();

			layout.bufferVars.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			const glu::DataType			elemBasicType	= elemType.getBasicType();
			const bool					isRowMajor		= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int					numVecs			= isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType)
																	 : glu::getDataTypeMatrixNumColumns(elemBasicType);
			const int					vecStride		= baseAlignment;
			BufferVarLayoutEntry		entry;

			entry.name					= curPrefix + "[0]"; // Array variables are always postfixed with [0]
			entry.type					= elemBasicType;
			entry.blockNdx				= curBlockNdx;
			entry.offset				= curOffset;
			entry.arraySize				= type.getArraySize();
			entry.arrayStride			= vecStride*numVecs;
			entry.matrixStride			= vecStride;
			entry.isRowMajor			= isRowMajor;
			entry.topLevelArraySize		= topLevelArraySize;
			entry.topLevelArrayStride	= topLevelArrayStride;

			curOffset += numVecs*vecStride*type.getArraySize();

			layout.bufferVars.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				curOffset += computeReferenceLayout(layout, curBlockNdx, curOffset, curPrefix + "[" + de::toString(elemNdx) + "]", type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			curOffset += computeReferenceLayout(layout, curBlockNdx, curOffset, curPrefix + "." + memberIter->getName(), memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}

	return curOffset-baseOffset;
}